

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLsslset curl_global_sslset(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  int iVar1;
  Curl_ssl *pCVar2;
  CURLsslset CVar3;
  Curl_ssl **ppCVar4;
  
  if (avail != (curl_ssl_backend ***)0x0) {
    *avail = (curl_ssl_backend **)available_backends;
  }
  if (Curl_ssl == &Curl_ssl_multi) {
    CVar3 = CURLSSLSET_UNKNOWN_BACKEND;
    if (available_backends[0] != (Curl_ssl *)0x0) {
      if ((available_backends[0]->info).id == id) {
        ppCVar4 = available_backends;
      }
      else {
        ppCVar4 = available_backends;
        pCVar2 = available_backends[0];
        do {
          if ((name != (char *)0x0) &&
             (iVar1 = Curl_strcasecompare((pCVar2->info).name,name), iVar1 != 0)) break;
          pCVar2 = ppCVar4[1];
          if (pCVar2 == (Curl_ssl *)0x0) {
            return CURLSSLSET_UNKNOWN_BACKEND;
          }
          ppCVar4 = ppCVar4 + 1;
        } while ((pCVar2->info).id != id);
      }
      multissl_init(*ppCVar4);
      CVar3 = CURLSSLSET_OK;
    }
  }
  else {
    CVar3 = CURLSSLSET_OK;
    if ((Curl_ssl->info).id != id) {
      if (name == (char *)0x0) {
        CVar3 = CURLSSLSET_UNKNOWN_BACKEND;
      }
      else {
        iVar1 = Curl_strcasecompare(name,(Curl_ssl->info).name);
        CVar3 = (CURLsslset)(iVar1 == 0);
      }
    }
  }
  return CVar3;
}

Assistant:

CURLsslset curl_global_sslset(curl_sslbackend id, const char *name,
                              const curl_ssl_backend ***avail)
{
  int i;

  if(avail)
    *avail = (const curl_ssl_backend **)&available_backends;

  if(Curl_ssl != &Curl_ssl_multi)
    return id == Curl_ssl->info.id ||
           (name && strcasecompare(name, Curl_ssl->info.name)) ?
           CURLSSLSET_OK :
#if defined(CURL_WITH_MULTI_SSL)
           CURLSSLSET_TOO_LATE;
#else
           CURLSSLSET_UNKNOWN_BACKEND;
#endif

  for(i = 0; available_backends[i]; i++) {
    if(available_backends[i]->info.id == id ||
       (name && strcasecompare(available_backends[i]->info.name, name))) {
      multissl_init(available_backends[i]);
      return CURLSSLSET_OK;
    }
  }

  return CURLSSLSET_UNKNOWN_BACKEND;
}